

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_vector_s.c
# Opt level: O0

int cesl_vector_s_insert(cesl_vector_s_t *self,size_t index,void *elm_ptr)

{
  bool bVar1;
  void *elm_ptr_local;
  size_t index_local;
  cesl_vector_s_t *self_local;
  
  bVar1 = self->elems_count_ < self->elems_max_count_;
  if (bVar1) {
    cesl_vector_s_move_elements(self,index,index + 1);
    cesl_vector_s_insert_at(self,index,elm_ptr,self->elem_max_size_);
  }
  self_local._4_4_ = (uint)bVar1;
  return self_local._4_4_;
}

Assistant:

int cesl_vector_s_insert(cesl_vector_s_t* self, size_t index, const void* elm_ptr)
{
    if (self->elems_count_ < self->elems_max_count_) {
        cesl_vector_s_move_elements(self, index, index + 1u);
        cesl_vector_s_insert_at(self, index, elm_ptr, self->elem_max_size_);
        return 1;
    }
    return 0;
}